

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  naiveproxy *this;
  
  this = naiveproxy::GetInstance();
  naiveproxy::daemonize(this);
  naivelog::GetInstance();
  naiveproxy::init_proxys(this);
  do {
  } while( true );
}

Assistant:

int main()
{
	naiveproxy *np = naiveproxy::GetInstance();

	//设置守护进程
	np->daemonize();

	//初始化日志
	naivelog::GetInstance();

	//执行proxy
	np->init_proxys();

	while (1)
		;

	naiveproxy::DestroyInstance();

	return 0;
}